

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx::forward(Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint _c;
  int iVar5;
  uint uVar6;
  _func_int *p_Var7;
  size_t sVar8;
  _func_int **pp_Var9;
  int *piVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  int iVar36;
  uint uVar37;
  sbyte sVar38;
  undefined1 (*pauVar39) [32];
  int iVar40;
  ulong uVar41;
  float fVar42;
  ulong uVar43;
  int unaff_EBP;
  ulong uVar44;
  uint uVar45;
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [16];
  int iVar49;
  int iVar50;
  size_t sVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 (*pauVar55) [32];
  undefined1 (*pauVar56) [16];
  long lVar57;
  ulong uVar58;
  int iVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined8 in_XMM1_Qa;
  undefined8 uVar64;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  undefined8 in_stack_fffffffffffffe98;
  Mat *pMVar65;
  undefined4 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  Mat m_1;
  Mat m;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined3 uVar32;
  undefined2 uVar34;
  
  p_Var7 = this->_vptr_Padding_x86_avx[-3];
  if (((((*(int *)(&this->field_0xd0 + (long)p_Var7) == 0) &&
        (*(int *)(&this->field_0xd4 + (long)p_Var7) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var7) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var7) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var7) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var7) == 0)) {
    Mat::operator=(top_blob,bottom_blob);
    iVar36 = 0;
  }
  else {
    fVar42 = (float)bottom_blob->elempack;
    if ((fVar42 != 0.0) && (((int)bottom_blob->elemsize << 3) / (int)fVar42 == 8)) {
      iVar36 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar36;
    }
    iVar36 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar4 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar5 = bottom_blob->dims;
    uVar44 = bottom_blob->elemsize;
    pMVar65 = bottom_blob;
    if (fVar42 == 1.12104e-44) {
      if (iVar5 == 1) {
        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var7) + iVar36 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var7) | uVar37) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
          uVar45 = uVar37 + 7;
          if (-1 < (int)uVar37) {
            uVar45 = uVar37;
          }
          Mat::create(top_blob,(int)uVar45 >> 3,(uVar44 >> 3) << sVar38,8,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar50 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar40 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar49 = iVar50 + 7;
              if (-1 < iVar50) {
                iVar49 = iVar50;
              }
              iVar50 = iVar40 + 7;
              if (-1 < iVar40) {
                iVar50 = iVar40;
              }
              v_00._8_8_ = this;
              v_00[0] = (float)(int)in_stack_fffffffffffffe98;
              v_00[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
              v_00._16_8_ = bottom_blob;
              v_00[6] = (float)in_stack_fffffffffffffeb0;
              v_00[7] = in_stack_fffffffffffffeb4;
              padding_constant_pack8_avx(bottom_blob,top_blob,0,0,iVar49 >> 3,iVar50 >> 3,v_00);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 2) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd0 + (long)p_Var7) + iVar3 * 8 +
                 *(int *)(&this->field_0xd4 + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var7) | uVar37) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
          uVar45 = uVar37 + 7;
          if (-1 < (int)uVar37) {
            uVar45 = uVar37;
          }
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var7) + iVar36 +
                               *(int *)(&this->field_0xdc + (long)p_Var7),(int)uVar45 >> 3,
                      (uVar44 >> 3) << sVar38,8,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var7 = this->_vptr_Padding_x86_avx[-3];
              iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
              iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var7);
              iVar49 = iVar50 + 7;
              if (-1 < iVar50) {
                iVar49 = iVar50;
              }
              iVar50 = iVar40 + 7;
              if (-1 < iVar40) {
                iVar50 = iVar40;
              }
              v_01._8_8_ = this;
              v_01[0] = (float)(int)in_stack_fffffffffffffe98;
              v_01[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
              v_01._16_8_ = bottom_blob;
              v_01[6] = (float)in_stack_fffffffffffffeb0;
              v_01[7] = in_stack_fffffffffffffeb4;
              padding_constant_pack8_avx
                        (bottom_blob,top_blob,iVar49 >> 3,iVar50 >> 3,
                         *(int *)(&this->field_0xd8 + (long)p_Var7),
                         *(int *)(&this->field_0xdc + (long)p_Var7),v_01);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      pMVar65 = bottom_blob;
      if (iVar5 == 3) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xe8 + (long)p_Var7) + _c * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var7) | uVar37) & 7) == 0) {
          if ((uVar37 == _c * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
            uVar45 = uVar37 + 7;
            if (-1 < (int)uVar37) {
              uVar45 = uVar37;
            }
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var7) + iVar36 +
                                 *(int *)(&this->field_0xdc + (long)p_Var7),
                        *(int *)(&this->field_0xd0 + (long)p_Var7) + iVar3 +
                        *(int *)(&this->field_0xd4 + (long)p_Var7),(int)uVar45 >> 3,
                        (uVar44 >> 3) << sVar38,8,opt->blob_allocator);
            unaff_EBP = -100;
            pMVar65 = bottom_blob;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              iVar50 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar40 = iVar50 + 7;
              if (-1 < iVar50) {
                iVar40 = iVar50;
              }
              if (7 < (int)uVar37) {
                uVar43 = 0;
                do {
                  if (top_blob->dims == 3) {
                    iVar50 = top_blob->w;
                    sVar8 = top_blob->elemsize;
                    m.data = (void *)(top_blob->cstep * uVar43 * sVar8 + (long)top_blob->data);
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.elemsize._0_4_ = (undefined4)sVar8;
                    m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    m.w = iVar50;
                    m.dims = 2;
                    m.c = 1;
                  }
                  else {
                    iVar50 = top_blob->w;
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    sVar8 = top_blob->elemsize;
                    m.data = (void *)(top_blob->cstep * uVar43 * sVar8 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.elemsize._0_4_ = (undefined4)sVar8;
                    m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    m.w = iVar50;
                    m.dims = 3;
                  }
                  m.d = 1;
                  m.refcount._4_4_ = 0;
                  m.refcount._0_4_ = 0;
                  m.cstep = (long)m.h * (long)iVar50;
                  p_Var7 = this->_vptr_Padding_x86_avx[-3];
                  if (*(int *)(&this->field_0xf0 + (long)p_Var7) == 0) {
                    uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
                    auVar62._4_4_ = uVar2;
                    auVar62._0_4_ = uVar2;
                    auVar62._8_4_ = uVar2;
                    auVar62._12_4_ = uVar2;
                    auVar62._16_4_ = uVar2;
                    auVar62._20_4_ = uVar2;
                    auVar62._24_4_ = uVar2;
                    auVar62._28_4_ = uVar2;
                  }
                  else {
                    auVar62 = *(undefined1 (*) [32])
                               (*(long *)(&this->field_0xf8 + (long)p_Var7) + uVar43 * 0x20);
                  }
                  uVar37 = (int)uVar43 - (iVar40 >> 3);
                  if ((int)uVar37 < 0 || (int)_c <= (int)uVar37) {
                    iVar50 = m.c * (int)m.cstep;
                    pauVar39 = (undefined1 (*) [32])m.data;
                    if (0 < iVar50) {
                      do {
                        *pauVar39 = auVar62;
                        iVar50 = iVar50 + -1;
                        pauVar39 = pauVar39 + 1;
                      } while (iVar50 != 0);
                    }
                  }
                  else {
                    m_1.w = bottom_blob->w;
                    m_1.h = bottom_blob->h;
                    if (bottom_blob->dims == 3) {
                      sVar8 = bottom_blob->elemsize;
                      m_1.data = (void *)((ulong)uVar37 * bottom_blob->cstep * sVar8 +
                                         (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar8;
                      m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m_1.dims = 2;
                      m_1.c = 1;
                    }
                    else {
                      m_1.c = bottom_blob->d;
                      sVar8 = bottom_blob->elemsize;
                      m_1.data = (void *)((ulong)uVar37 * bottom_blob->cstep * sVar8 +
                                         (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar8;
                      m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m_1.dims = 3;
                    }
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                    p_Var7 = this->_vptr_Padding_x86_avx[-3];
                    bottom_blob = pMVar65;
                    if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0) {
                      v._8_8_ = this;
                      v[0] = (float)(int)in_stack_fffffffffffffe98;
                      v[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
                      v._16_8_ = pMVar65;
                      v[6] = (float)in_stack_fffffffffffffeb0;
                      v[7] = fVar42;
                      padding_constant_pack8_avx
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var7),
                                 *(int *)(&this->field_0xd4 + (long)p_Var7),
                                 *(int *)(&this->field_0xd8 + (long)p_Var7),
                                 *(int *)(&this->field_0xdc + (long)p_Var7),v);
                      bottom_blob = pMVar65;
                    }
                    pp_Var9 = this->_vptr_Padding_x86_avx;
                    p_Var7 = pp_Var9[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 1) {
                      iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
                      iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                      iVar54 = *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var7);
                      pauVar39 = (undefined1 (*) [32])m.data;
                      if (0 < iVar50) {
                        iVar52 = 0;
                        do {
                          auVar62 = *m_1.data;
                          iVar53 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar53 = iVar53 + -1;
                            } while (iVar53 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar53 = 0;
                            pauVar47 = (undefined1 (*) [32])m_1.data;
                            do {
                              auVar62 = *pauVar47;
                              *pauVar39 = auVar62;
                              pauVar47 = pauVar47 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar53 = iVar53 + 1;
                            } while (iVar53 < m_1.w);
                          }
                          iVar53 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar53 = iVar53 + -1;
                            } while (iVar53 != 0);
                          }
                          iVar52 = iVar52 + 1;
                        } while (iVar52 != iVar50);
                      }
                      pauVar47 = (undefined1 (*) [32])m_1.data;
                      if (0 < m_1.h) {
                        iVar50 = 0;
                        do {
                          auVar62 = *pauVar47;
                          iVar52 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar52 = 0;
                            do {
                              auVar62 = *pauVar47;
                              *pauVar39 = auVar62;
                              pauVar47 = pauVar47 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + 1;
                            } while (iVar52 < m_1.w);
                          }
                          iVar52 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          iVar50 = iVar50 + 1;
                        } while (iVar50 < m_1.h);
                      }
                      if (0 < iVar49) {
                        iVar50 = 0;
                        do {
                          auVar62 = pauVar47[-(long)m_1.w];
                          iVar52 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar52 = 0;
                            pauVar55 = pauVar47 + -(long)m_1.w;
                            do {
                              auVar62 = *pauVar55;
                              *pauVar39 = auVar62;
                              pauVar55 = pauVar55 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + 1;
                            } while (iVar52 < m_1.w);
                          }
                          iVar52 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *pauVar39 = auVar62;
                              pauVar39 = pauVar39 + 1;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          iVar50 = iVar50 + 1;
                        } while (iVar50 != iVar49);
                      }
                    }
                    p_Var7 = pp_Var9[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 2) {
                      iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
                      iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                      uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var7);
                      uVar58 = (ulong)uVar37;
                      uVar6 = *(uint *)(&this->field_0xdc + (long)p_Var7);
                      uVar41 = (ulong)uVar6;
                      pauVar47 = (undefined1 (*) [32])
                                 ((long)(m_1.w * iVar50 * 8) * 4 + (long)m_1.data);
                      pauVar39 = (undefined1 (*) [32])m.data;
                      if (0 < iVar50) {
                        iVar54 = 0;
                        do {
                          lVar57 = uVar58 << 5;
                          if (0 < (int)uVar37) {
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar47 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar57 != 0);
                          }
                          pauVar55 = pauVar47;
                          if (0 < m_1.w) {
                            iVar59 = 0;
                            do {
                              *pauVar39 = *pauVar55;
                              pauVar55 = pauVar55 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar59 = iVar59 + 1;
                            } while (iVar59 < m_1.w);
                          }
                          if (0 < (int)uVar6) {
                            lVar57 = -0x40;
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar55 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar1 = uVar41 * 0x20 + lVar57;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          pauVar47 = pauVar47 + -(long)m_1.w;
                          iVar54 = iVar54 + 1;
                        } while (iVar54 != iVar50);
                      }
                      if (0 < m_1.h) {
                        iVar50 = 0;
                        do {
                          lVar57 = uVar58 << 5;
                          if (0 < (int)uVar37) {
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar47 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar57 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar54 = 0;
                            do {
                              *pauVar39 = *pauVar47;
                              pauVar47 = pauVar47 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar54 = iVar54 + 1;
                            } while (iVar54 < m_1.w);
                          }
                          if (0 < (int)uVar6) {
                            lVar57 = -0x40;
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar47 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar1 = uVar41 * 0x20 + lVar57;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          iVar50 = iVar50 + 1;
                        } while (iVar50 < m_1.h);
                      }
                      if (0 < iVar49) {
                        pauVar47 = pauVar47 + (long)m_1.w * -2;
                        iVar50 = 0;
                        do {
                          lVar57 = uVar58 << 5;
                          if (0 < (int)uVar37) {
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar47 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar57 != 0);
                          }
                          pauVar55 = pauVar47;
                          if (0 < m_1.w) {
                            iVar54 = 0;
                            do {
                              *pauVar39 = *pauVar55;
                              pauVar55 = pauVar55 + 1;
                              pauVar39 = pauVar39 + 1;
                              iVar54 = iVar54 + 1;
                            } while (iVar54 < m_1.w);
                          }
                          if (0 < (int)uVar6) {
                            lVar57 = -0x40;
                            do {
                              *pauVar39 = *(undefined1 (*) [32])(*pauVar55 + lVar57);
                              pauVar39 = pauVar39 + 1;
                              lVar1 = uVar41 * 0x20 + lVar57;
                              lVar57 = lVar57 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          pauVar47 = pauVar47 + -(long)m_1.w;
                          iVar50 = iVar50 + 1;
                        } while (iVar50 != iVar49);
                      }
                    }
                    piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    pMVar65 = bottom_blob;
                  }
                  piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          bottom_blob = pMVar65;
                          free(m.data);
                          pMVar65 = bottom_blob;
                        }
                      }
                      else {
                        bottom_blob = pMVar65;
                        (*(m.allocator)->_vptr_Allocator[3])();
                        pMVar65 = bottom_blob;
                      }
                    }
                  }
                  m.cstep = 0;
                  in_XMM1_Qa = 0;
                  m.data = (void *)0x0;
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = 0;
                  m.elemsize._4_4_ = 0;
                  m.elempack = 0;
                  m.dims = 0;
                  m.w = 0;
                  m.h = 0;
                  m.d = 0;
                  m.c = 0;
                  uVar43 = uVar43 + 1;
                } while (uVar43 != (uint)((int)uVar45 >> 3));
              }
              unaff_EBP = 0;
            }
            bVar11 = false;
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 4) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        iVar50 = *(int *)(&this->field_0xe0 + (long)p_Var7);
        if (iVar50 == 0) {
          uVar37 = *(int *)(&this->field_0xe8 + (long)p_Var7) + iVar4 +
                   *(int *)(&this->field_0xec + (long)p_Var7);
          bottom_blob = pMVar65;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var7) + iVar36 +
                               *(int *)(&this->field_0xdc + (long)p_Var7),
                      *(int *)(&this->field_0xd0 + (long)p_Var7) + iVar3 +
                      *(int *)(&this->field_0xd4 + (long)p_Var7),uVar37,_c,uVar44,8,
                      opt->blob_allocator);
          unaff_EBP = -100;
          pMVar65 = bottom_blob;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar43 = 0;
              do {
                p_Var7 = this->_vptr_Padding_x86_avx[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var7) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
                  auVar63._4_4_ = uVar2;
                  auVar63._0_4_ = uVar2;
                  auVar63._8_4_ = uVar2;
                  auVar63._12_4_ = uVar2;
                  auVar63._16_4_ = uVar2;
                  auVar63._20_4_ = uVar2;
                  auVar63._24_4_ = uVar2;
                  auVar63._28_4_ = uVar2;
                }
                else {
                  auVar63 = *(undefined1 (*) [32])
                             (*(long *)(&this->field_0xf8 + (long)p_Var7) + uVar43 * 0x20);
                }
                if (0 < (int)uVar37) {
                  uVar58 = 0;
                  do {
                    sVar8 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar51 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar58 * sVar8 * sVar51 + top_blob->cstep * uVar43 * sVar8);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar8;
                    m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    iVar40 = (int)uVar58 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                    if (iVar40 < 0 || iVar4 <= iVar40) {
                      m.cstep._0_4_ = (int)sVar51;
                      pauVar39 = (undefined1 (*) [32])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar39 = auVar63;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar39 = pauVar39 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      sVar8 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.h = bottom_blob->h;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar8 *
                                         ((long)(int)uVar58 -
                                         (long)*(int *)(&this->field_0xe8 +
                                                       (long)this->_vptr_Padding_x86_avx[-3])) +
                                         bottom_blob->cstep * uVar43 * sVar8);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar8;
                      m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var7 = this->_vptr_Padding_x86_avx[-3];
                      v_02._8_8_ = this;
                      v_02[0] = (float)(int)in_stack_fffffffffffffe98;
                      v_02[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
                      v_02._16_8_ = bottom_blob;
                      v_02[6] = (float)in_stack_fffffffffffffeb0;
                      v_02[7] = fVar42;
                      m.cstep = sVar51;
                      padding_constant_pack8_avx
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var7),
                                 *(int *)(&this->field_0xd4 + (long)p_Var7),
                                 *(int *)(&this->field_0xd8 + (long)p_Var7),
                                 *(int *)(&this->field_0xdc + (long)p_Var7),v_02);
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      sVar51 = m.cstep;
                    }
                    m.cstep = sVar51;
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar58 = uVar58 + 1;
                  } while (uVar58 != uVar37);
                }
                uVar43 = uVar43 + 1;
              } while (uVar43 != _c);
              unaff_EBP = 0;
              pMVar65 = bottom_blob;
            }
          }
        }
        if (iVar50 == 0) {
          return unaff_EBP;
        }
      }
    }
    if (fVar42 == 5.60519e-45) {
      if (iVar5 == 1) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var7) + iVar36 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var7) & 3) == 0) && ((uVar37 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
          bottom_blob = pMVar65;
          Mat::create(top_blob,(int)uVar37 >> 2,(uVar44 >> 2) << sVar38,4,opt->blob_allocator);
          unaff_EBP = -100;
          pMVar65 = bottom_blob;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var7 = this->_vptr_Padding_x86_avx[-3];
              v_04[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
              v_04[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
              iVar50 = *(int *)(&this->field_0xd8 + (long)p_Var7);
              iVar40 = *(int *)(&this->field_0xdc + (long)p_Var7);
              iVar49 = iVar50 + 3;
              if (-1 < iVar50) {
                iVar49 = iVar50;
              }
              iVar50 = iVar40 + 3;
              if (-1 < iVar40) {
                iVar50 = iVar40;
              }
              v_04[2] = (float)(int)in_XMM1_Qa;
              v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              padding_constant_pack4_sse(bottom_blob,top_blob,0,0,iVar49 >> 2,iVar50 >> 2,v_04);
              unaff_EBP = 0;
              pMVar65 = bottom_blob;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 2) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd0 + (long)p_Var7) + iVar3 * 4 +
                 *(int *)(&this->field_0xd4 + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var7) & 3) == 0) && ((uVar37 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
          bottom_blob = pMVar65;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var7) + iVar36 +
                               *(int *)(&this->field_0xdc + (long)p_Var7),(int)uVar37 >> 2,
                      (uVar44 >> 2) << sVar38,4,opt->blob_allocator);
          unaff_EBP = -100;
          pMVar65 = bottom_blob;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var7 = this->_vptr_Padding_x86_avx[-3];
              iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
              iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var7);
              iVar49 = iVar50 + 3;
              if (-1 < iVar50) {
                iVar49 = iVar50;
              }
              iVar50 = iVar40 + 3;
              if (-1 < iVar40) {
                iVar50 = iVar40;
              }
              v_05[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
              v_05[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
              v_05[2] = (float)(int)in_XMM1_Qa;
              v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              padding_constant_pack4_sse
                        (bottom_blob,top_blob,iVar49 >> 2,iVar50 >> 2,
                         *(int *)(&this->field_0xd8 + (long)p_Var7),
                         *(int *)(&this->field_0xdc + (long)p_Var7),v_05);
              unaff_EBP = 0;
              pMVar65 = bottom_blob;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 3) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xe8 + (long)p_Var7) + _c * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var7);
        sVar38 = 3;
        if ((uVar37 & 7) != 0) {
          sVar38 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var7) & 3) == 0) && ((uVar37 & 7) == 4)) {
          if ((uVar37 == _c * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0)) {
            uVar37 = (int)uVar37 >> 2;
            bottom_blob = pMVar65;
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var7) + iVar36 +
                                 *(int *)(&this->field_0xdc + (long)p_Var7),
                        *(int *)(&this->field_0xd0 + (long)p_Var7) + iVar3 +
                        *(int *)(&this->field_0xd4 + (long)p_Var7),uVar37,(uVar44 >> 2) << sVar38,4,
                        opt->blob_allocator);
            unaff_EBP = -100;
            pMVar65 = bottom_blob;
            if (top_blob->data == (void *)0x0) {
              bVar11 = false;
            }
            else {
              bVar11 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar50 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                iVar40 = iVar50 + 3;
                if (-1 < iVar50) {
                  iVar40 = iVar50;
                }
                if (0 < (int)uVar37) {
                  uVar43 = 0;
                  do {
                    if (top_blob->dims == 3) {
                      iVar50 = top_blob->w;
                      sVar8 = top_blob->elemsize;
                      m.data = (void *)(top_blob->cstep * uVar43 * sVar8 + (long)top_blob->data);
                      m.h = top_blob->h;
                      m.elempack = top_blob->elempack;
                      m.allocator = top_blob->allocator;
                      m.elemsize._0_4_ = (undefined4)sVar8;
                      m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m.w = iVar50;
                      m.dims = 2;
                      m.c = 1;
                    }
                    else {
                      iVar50 = top_blob->w;
                      m.h = top_blob->h;
                      m.c = top_blob->d;
                      sVar8 = top_blob->elemsize;
                      m.data = (void *)(top_blob->cstep * uVar43 * sVar8 + (long)top_blob->data);
                      m.elempack = top_blob->elempack;
                      m.allocator = top_blob->allocator;
                      m.elemsize._0_4_ = (undefined4)sVar8;
                      m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m.w = iVar50;
                      m.dims = 3;
                    }
                    m.d = 1;
                    m.refcount._4_4_ = 0;
                    m.refcount._0_4_ = 0;
                    m.cstep = (long)m.h * (long)iVar50;
                    p_Var7 = this->_vptr_Padding_x86_avx[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var7) == 0) {
                      uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
                      auVar60._4_4_ = uVar2;
                      auVar60._0_4_ = uVar2;
                      auVar60._8_4_ = uVar2;
                      auVar60._12_4_ = uVar2;
                    }
                    else {
                      auVar60 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var7) + uVar43 * 0x10);
                    }
                    uVar45 = (int)uVar43 - (iVar40 >> 2);
                    if ((int)uVar45 < 0 || (int)_c <= (int)uVar45) {
                      if (0 < m.c * (int)m.cstep) {
                        lVar57 = 0;
                        do {
                          *(undefined1 (*) [16])((long)m.data + lVar57) = auVar60;
                          lVar57 = lVar57 + 0x10;
                        } while ((ulong)(uint)(m.c * (int)m.cstep) << 4 != lVar57);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      if (bottom_blob->dims == 3) {
                        sVar8 = bottom_blob->elemsize;
                        m_1.data = (void *)((ulong)uVar45 * bottom_blob->cstep * sVar8 +
                                           (long)bottom_blob->data);
                        m_1.elempack = bottom_blob->elempack;
                        m_1.allocator = bottom_blob->allocator;
                        m_1.elemsize._0_4_ = (undefined4)sVar8;
                        m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                        m_1.dims = 2;
                        m_1.c = 1;
                      }
                      else {
                        m_1.c = bottom_blob->d;
                        sVar8 = bottom_blob->elemsize;
                        m_1.data = (void *)((ulong)uVar45 * bottom_blob->cstep * sVar8 +
                                           (long)bottom_blob->data);
                        m_1.elempack = bottom_blob->elempack;
                        m_1.allocator = bottom_blob->allocator;
                        m_1.elemsize._0_4_ = (undefined4)sVar8;
                        m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                        m_1.dims = 3;
                      }
                      m_1.d = 1;
                      m_1.refcount._4_4_ = 0;
                      m_1.refcount._0_4_ = 0;
                      m_1.cstep = (long)m_1.h * (long)m_1.w;
                      p_Var7 = this->_vptr_Padding_x86_avx[-3];
                      bottom_blob = pMVar65;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 0) {
                        v_03._0_8_ = auVar60._0_8_;
                        v_03[2] = 0.0;
                        v_03[3] = 0.0;
                        padding_constant_pack4_sse
                                  (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var7),
                                   *(int *)(&this->field_0xd4 + (long)p_Var7),
                                   *(int *)(&this->field_0xd8 + (long)p_Var7),
                                   *(int *)(&this->field_0xdc + (long)p_Var7),v_03);
                        bottom_blob = pMVar65;
                      }
                      pp_Var9 = this->_vptr_Padding_x86_avx;
                      p_Var7 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 1) {
                        iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
                        iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                        iVar54 = *(int *)(&this->field_0xd8 + (long)p_Var7);
                        iVar59 = *(int *)(&this->field_0xdc + (long)p_Var7);
                        pauVar46 = (undefined1 (*) [16])m.data;
                        if (0 < iVar50) {
                          iVar52 = 0;
                          do {
                            auVar60 = *m_1.data;
                            iVar53 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar53 = 0;
                              pauVar48 = (undefined1 (*) [16])m_1.data;
                              do {
                                auVar60 = *pauVar48;
                                *pauVar46 = auVar60;
                                pauVar48 = pauVar48 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + 1;
                              } while (iVar53 < m_1.w);
                            }
                            iVar53 = iVar59;
                            if (0 < iVar59) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar50);
                        }
                        pauVar48 = (undefined1 (*) [16])m_1.data;
                        if (0 < m_1.h) {
                          iVar50 = 0;
                          do {
                            auVar60 = *pauVar48;
                            iVar52 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + -1;
                              } while (iVar52 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar52 = 0;
                              do {
                                auVar60 = *pauVar48;
                                *pauVar46 = auVar60;
                                pauVar48 = pauVar48 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + 1;
                              } while (iVar52 < m_1.w);
                            }
                            iVar52 = iVar59;
                            if (0 < iVar59) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + -1;
                              } while (iVar52 != 0);
                            }
                            iVar50 = iVar50 + 1;
                          } while (iVar50 < m_1.h);
                        }
                        if (0 < iVar49) {
                          iVar50 = 0;
                          do {
                            auVar60 = pauVar48[-(long)m_1.w];
                            iVar52 = iVar54;
                            if (0 < iVar54) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + -1;
                              } while (iVar52 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar52 = 0;
                              pauVar56 = pauVar48 + -(long)m_1.w;
                              do {
                                auVar60 = *pauVar56;
                                *pauVar46 = auVar60;
                                pauVar56 = pauVar56 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + 1;
                              } while (iVar52 < m_1.w);
                            }
                            iVar52 = iVar59;
                            if (0 < iVar59) {
                              do {
                                *pauVar46 = auVar60;
                                pauVar46 = pauVar46 + 1;
                                iVar52 = iVar52 + -1;
                              } while (iVar52 != 0);
                            }
                            iVar50 = iVar50 + 1;
                          } while (iVar50 != iVar49);
                        }
                      }
                      p_Var7 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var7) == 2) {
                        iVar50 = *(int *)(&this->field_0xd0 + (long)p_Var7);
                        iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                        uVar45 = *(uint *)(&this->field_0xd8 + (long)p_Var7);
                        uVar58 = (ulong)uVar45;
                        uVar6 = *(uint *)(&this->field_0xdc + (long)p_Var7);
                        uVar41 = (ulong)uVar6;
                        pauVar48 = (undefined1 (*) [16])
                                   ((long)(m_1.w * iVar50 * 4) * 4 + (long)m_1.data);
                        pauVar46 = (undefined1 (*) [16])m.data;
                        if (0 < iVar50) {
                          iVar54 = 0;
                          do {
                            lVar57 = uVar58 << 4;
                            if (0 < (int)uVar45) {
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar48 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            pauVar56 = pauVar48;
                            if (0 < m_1.w) {
                              iVar59 = 0;
                              do {
                                *pauVar46 = *pauVar56;
                                pauVar56 = pauVar56 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar59 = iVar59 + 1;
                              } while (iVar59 < m_1.w);
                            }
                            if (0 < (int)uVar6) {
                              lVar57 = -0x20;
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar56 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar41 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar48 = pauVar48 + -(long)m_1.w;
                            iVar54 = iVar54 + 1;
                          } while (iVar54 != iVar50);
                        }
                        if (0 < m_1.h) {
                          iVar50 = 0;
                          do {
                            lVar57 = uVar58 << 4;
                            if (0 < (int)uVar45) {
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar48 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                *pauVar46 = *pauVar48;
                                pauVar48 = pauVar48 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            if (0 < (int)uVar6) {
                              lVar57 = -0x20;
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar48 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar41 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            iVar50 = iVar50 + 1;
                          } while (iVar50 < m_1.h);
                        }
                        if (0 < iVar49) {
                          pauVar48 = pauVar48 + (long)m_1.w * -2;
                          iVar50 = 0;
                          do {
                            lVar57 = uVar58 << 4;
                            if (0 < (int)uVar45) {
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar48 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar57 != 0);
                            }
                            pauVar56 = pauVar48;
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                *pauVar46 = *pauVar56;
                                pauVar56 = pauVar56 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            if (0 < (int)uVar6) {
                              lVar57 = -0x20;
                              do {
                                *pauVar46 = *(undefined1 (*) [16])(*pauVar56 + lVar57);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar41 * 0x10 + lVar57;
                                lVar57 = lVar57 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar48 = pauVar48 + -(long)m_1.w;
                            iVar50 = iVar50 + 1;
                          } while (iVar50 != iVar49);
                        }
                      }
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      pMVar65 = bottom_blob;
                    }
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            bottom_blob = pMVar65;
                            free(m.data);
                            pMVar65 = bottom_blob;
                          }
                        }
                        else {
                          bottom_blob = pMVar65;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pMVar65 = bottom_blob;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar43 = uVar43 + 1;
                  } while (uVar43 != uVar37);
                }
                bVar11 = false;
                unaff_EBP = 0;
              }
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar5 == 4) {
        p_Var7 = this->_vptr_Padding_x86_avx[-3];
        iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var7);
        if (iVar5 == 0) {
          uVar37 = *(int *)(&this->field_0xe8 + (long)p_Var7) + iVar4 +
                   *(int *)(&this->field_0xec + (long)p_Var7);
          bottom_blob = pMVar65;
          Mat::create(top_blob,iVar36 + *(int *)(&this->field_0xd8 + (long)p_Var7) +
                               *(int *)(&this->field_0xdc + (long)p_Var7),
                      iVar3 + *(int *)(&this->field_0xd0 + (long)p_Var7) +
                      *(int *)(&this->field_0xd4 + (long)p_Var7),uVar37,_c,uVar44,4,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar44 = 0;
              do {
                p_Var7 = this->_vptr_Padding_x86_avx[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var7) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var7);
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                }
                else {
                  auVar61 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var7) + uVar44 * 0x10);
                }
                uVar64 = in_XMM1_Qa;
                if (0 < (int)uVar37) {
                  uVar43 = 0;
                  do {
                    sVar8 = top_blob->elemsize;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.h = top_blob->h;
                    m.cstep = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar43 * sVar8 * m.cstep + top_blob->cstep * uVar44 * sVar8);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar8;
                    m.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    iVar36 = (int)uVar43 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                    if (iVar36 < 0 || iVar4 <= iVar36) {
                      if (0 < (int)m.cstep) {
                        lVar57 = 0;
                        do {
                          *(undefined1 (*) [16])((long)m.data + lVar57) = auVar61;
                          lVar57 = lVar57 + 0x10;
                        } while ((m.cstep & 0xffffffff) << 4 != lVar57);
                      }
                    }
                    else {
                      sVar8 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.h = bottom_blob->h;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar8 *
                                         ((long)(int)uVar43 -
                                         (long)*(int *)(&this->field_0xe8 +
                                                       (long)this->_vptr_Padding_x86_avx[-3])) +
                                         bottom_blob->cstep * uVar44 * sVar8);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar8;
                      m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var7 = this->_vptr_Padding_x86_avx[-3];
                      v_06._0_8_ = auVar61._0_8_;
                      v_06[2] = (float)(int)in_XMM1_Qa;
                      v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var7),
                                 *(int *)(&this->field_0xd4 + (long)p_Var7),
                                 *(int *)(&this->field_0xd8 + (long)p_Var7),
                                 *(int *)(&this->field_0xdc + (long)p_Var7),v_06);
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                    }
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    in_XMM1_Qa = 0;
                    uVar64 = 0;
                    uVar43 = uVar43 + 1;
                  } while (uVar43 != uVar37);
                }
                uVar44 = uVar44 + 1;
                in_XMM1_Qa = uVar64;
              } while (uVar44 != _c);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar5 == 0) {
          return unaff_EBP;
        }
      }
    }
    piVar10 = bottom_blob->refcount;
    m.data = bottom_blob->data;
    m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
    m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.dims = bottom_blob->dims;
    m.w = bottom_blob->w;
    uVar12 = bottom_blob->h;
    uVar13 = bottom_blob->d;
    m.c = bottom_blob->c;
    m.cstep = bottom_blob->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    m.h = uVar12;
    m.d = uVar13;
    if (fVar42 != 1.4013e-45) {
      m_1.data = *(void **)opt;
      uVar14 = opt->openmp_blocktime;
      uVar15 = opt->use_winograd_convolution;
      uVar17 = opt->use_sgemm_convolution;
      uVar19 = opt->use_int8_inference;
      uVar21 = opt->use_vulkan_compute;
      uVar20 = CONCAT11(uVar21,uVar19);
      uVar18 = CONCAT21(uVar20,uVar17);
      uVar16 = CONCAT31(uVar18,uVar15);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar22 = opt->flush_denormals;
      uVar23 = opt->use_local_pool_allocator;
      uVar25 = opt->use_reserved_1;
      uVar27 = opt->use_reserved_2;
      uVar29 = opt->use_reserved_3;
      uVar28 = CONCAT11(uVar29,uVar27);
      uVar26 = CONCAT21(uVar28,uVar25);
      uVar24 = CONCAT31(uVar26,uVar23);
      uVar64._0_1_ = opt->use_reserved_4;
      uVar64._1_1_ = opt->use_reserved_5;
      uVar64._2_1_ = opt->use_reserved_6;
      uVar64._3_1_ = opt->use_reserved_7;
      uVar30 = opt->use_reserved_8;
      uVar31 = opt->use_reserved_9;
      uVar33 = opt->use_reserved_10;
      uVar35 = opt->use_reserved_11;
      uVar34 = CONCAT11(uVar35,uVar33);
      uVar32 = CONCAT21(uVar34,uVar31);
      uVar64._4_4_ = CONCAT31(uVar32,uVar30);
      m_1.c = (int)uVar64;
      m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.elempack = uVar14;
      m_1._28_4_ = uVar16;
      m_1.h = uVar22;
      m_1.d = uVar24;
      m_1._60_4_ = uVar64._4_4_;
      convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    }
    iVar36 = Padding::forward((Padding *)
                              ((long)&this->_vptr_Padding_x86_avx +
                              (long)this->_vptr_Padding_x86_avx[-3]),&m,top_blob,opt);
    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar36;
}

Assistant:

int Padding_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}